

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O3

int onig_new(regex_t **reg,OnigUChar *pattern,OnigUChar *pattern_end,OnigOptionType option,
            OnigEncoding enc,OnigSyntaxType *syntax,OnigErrorInfo *einfo)

{
  int iVar1;
  regex_t *prVar2;
  
  prVar2 = (regex_t *)malloc(0x1c8);
  *reg = prVar2;
  if (prVar2 == (regex_t *)0x0) {
    return -5;
  }
  iVar1 = onig_reg_init(prVar2,option,OnigDefaultCaseFoldFlag,enc,syntax);
  prVar2 = *reg;
  if (iVar1 == 0) {
    iVar1 = onig_compile(prVar2,pattern,pattern_end,einfo);
    if (iVar1 == 0) {
      return 0;
    }
    prVar2 = *reg;
    if (prVar2 == (regex_t *)0x0) goto LAB_0011cf58;
    onig_free_body(prVar2);
  }
  free(prVar2);
LAB_0011cf58:
  *reg = (regex_t *)0x0;
  return iVar1;
}

Assistant:

extern int
onig_new(regex_t** reg, const UChar* pattern, const UChar* pattern_end,
         OnigOptionType option, OnigEncoding enc, OnigSyntaxType* syntax,
         OnigErrorInfo* einfo)
{
  int r;

  *reg = (regex_t* )xmalloc(sizeof(regex_t));
  if (IS_NULL(*reg)) return ONIGERR_MEMORY;

  r = onig_reg_init(*reg, option, ONIGENC_CASE_FOLD_DEFAULT, enc, syntax);
  if (r != 0) {
    xfree(*reg);
    *reg = NULL;
    return r;
  }

  r = onig_compile(*reg, pattern, pattern_end, einfo);
  if (r != 0) {
    onig_free(*reg);
    *reg = NULL;
  }
  return r;
}